

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * ImGui::FindWindowByName(char *name)

{
  ImGuiContext *pIVar1;
  ImU32 IVar2;
  value_type *ppIVar3;
  int local_28;
  int i;
  ImGuiID id;
  ImGuiContext *g;
  char *name_local;
  
  pIVar1 = GImGui;
  IVar2 = ImHash(name,0,0);
  local_28 = 0;
  while( true ) {
    if ((pIVar1->Windows).Size <= local_28) {
      return (ImGuiWindow *)0x0;
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_28);
    if ((*ppIVar3)->ID == IVar2) break;
    local_28 = local_28 + 1;
  }
  ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_28);
  return *ppIVar3;
}

Assistant:

ImGuiWindow* ImGui::FindWindowByName(const char* name)
{
    // FIXME-OPT: Store sorted hashes -> pointers so we can do a bissection in a contiguous block
    ImGuiContext& g = *GImGui;
    ImGuiID id = ImHash(name, 0);
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i]->ID == id)
            return g.Windows[i];
    return NULL;
}